

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

void __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
::Connection(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
             *this,Socket *sock,
            Connections<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
            *connectionsHandler,
            RequestHandler<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>
            *handler)

{
  string_view fmt;
  char *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_stream_socket<std::experimental::net::v1::ip::tcp> *in_stack_ffffffffffffff88;
  Request *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *l;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  
  std::
  enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
  ::enable_shared_from_this
            ((enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::JasmineFS>_>_>
              *)0x12177c);
  l = in_RDI + 1;
  std::
  function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
  ::function((function<void_(std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>_&&,_webfront::http::Protocol)>
              *)in_stack_ffffffffffffff90);
  pbVar1 = in_RDI + 3;
  std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>::
  basic_stream_socket((basic_stream_socket<std::experimental::net::v1::ip::tcp> *)
                      in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI[5]._M_len = in_RDX;
  in_RDI[5]._M_str = in_RCX;
  Request::Request(in_stack_ffffffffffffff90);
  Response::Response((Response *)(in_RDI + 0x20b));
  *(undefined4 *)&in_RDI[0x20f]._M_len = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)l);
  fmt._M_str = (char *)pbVar1;
  fmt._M_len = in_RSI;
  log::debug<>::debug((debug<> *)in_RDI,fmt,(srcLoc *)l);
  return;
}

Assistant:

explicit Connection(typename Net::Socket sock, Connections<Connection>& connectionsHandler,
                        RequestHandler<Net, FS>& handler)
        : socket(std::move(sock)), connections(connectionsHandler), requestHandler(handler) {
        log::debug("New connection");
    }